

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlemgr.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSimpleHandleManager::AllocateHandle
          (CSimpleHandleManager *this,CPalThread *pThread,IPalObject *pObject,DWORD dwAccessRights,
          bool fInheritable,HANDLE *ph)

{
  ulong uVar1;
  HANDLE_TABLE_ENTRY *pHVar2;
  HANDLE pVVar3;
  anon_union_8_2_a10d9252_for_u aVar4;
  uint local_44;
  DWORD dw;
  HANDLE_TABLE_ENTRY *rghteTempTable;
  DWORD dwIndex;
  PAL_ERROR palError;
  HANDLE *ph_local;
  bool fInheritable_local;
  DWORD dwAccessRights_local;
  IPalObject *pObject_local;
  CPalThread *pThread_local;
  CSimpleHandleManager *this_local;
  
  rghteTempTable._4_4_ = 0;
  Lock(this,pThread);
  if (this->m_hiFreeListStart == 0xffffffffffffffff) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    if (0x3ffffffd < this->m_dwTableSize + this->m_dwTableGrowthRate) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      rghteTempTable._4_4_ = 0xe;
      goto LAB_001495b1;
    }
    pHVar2 = (HANDLE_TABLE_ENTRY *)
             InternalRealloc(this->m_rghteHandleTable,
                             (ulong)(this->m_dwTableSize + this->m_dwTableGrowthRate) << 4);
    if (pHVar2 == (HANDLE_TABLE_ENTRY *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      rghteTempTable._4_4_ = 0xe;
      goto LAB_001495b1;
    }
    this->m_rghteHandleTable = pHVar2;
    for (local_44 = this->m_dwTableSize; local_44 < this->m_dwTableSize + this->m_dwTableGrowthRate;
        local_44 = local_44 + 1) {
      aVar4.hiNextIndex._4_4_ = 0;
      aVar4.hiNextIndex._0_4_ = local_44 + 1;
      this->m_rghteHandleTable[local_44].u = aVar4;
      this->m_rghteHandleTable[local_44].fEntryAllocated = false;
    }
    this->m_hiFreeListStart = (ulong)this->m_dwTableSize;
    this->m_dwTableSize = this->m_dwTableGrowthRate + this->m_dwTableSize;
    this->m_rghteHandleTable[this->m_dwTableSize - 1].u.hiNextIndex = 0xffffffffffffffff;
    this->m_hiFreeListEnd = (ulong)(this->m_dwTableSize - 1);
  }
  uVar1 = this->m_hiFreeListStart;
  this->m_hiFreeListStart = (HANDLE_INDEX)this->m_rghteHandleTable[uVar1 & 0xffffffff].u;
  if (this->m_hiFreeListStart == 0xffffffffffffffff) {
    this->m_hiFreeListEnd = 0xffffffffffffffff;
  }
  pVVar3 = HandleIndexToHandle(this,uVar1 & 0xffffffff);
  *ph = pVVar3;
  (*pObject->_vptr_IPalObject[7])();
  this->m_rghteHandleTable[uVar1 & 0xffffffff].u.pObject = pObject;
  this->m_rghteHandleTable[uVar1 & 0xffffffff].dwAccessRights = dwAccessRights;
  this->m_rghteHandleTable[uVar1 & 0xffffffff].fInheritable = fInheritable;
  this->m_rghteHandleTable[uVar1 & 0xffffffff].fEntryAllocated = true;
LAB_001495b1:
  Unlock(this,pThread);
  return rghteTempTable._4_4_;
}

Assistant:

PAL_ERROR
CSimpleHandleManager::AllocateHandle(
    CPalThread *pThread,
    IPalObject *pObject,
    DWORD dwAccessRights,
    bool fInheritable,
    HANDLE *ph
    )
{
    PAL_ERROR palError = NO_ERROR;
    DWORD dwIndex;

    Lock(pThread);

    /* if no free handles are available, we need to grow the handle table and
       add new handles to the pool */
    if (m_hiFreeListStart == c_hiInvalid)
    {
        HANDLE_TABLE_ENTRY* rghteTempTable;

        TRACE("Handle pool empty (%d handles allocated), growing handle table "
              "by %d entries.\n", m_dwTableSize, m_dwTableGrowthRate );

        /* make sure handle values don't overflow */
        if (m_dwTableSize + m_dwTableGrowthRate >= c_MaxIndex)
        {
            WARN("Unable to allocate handle : maximum (%d) reached!\n",
                 m_dwTableSize);
            palError = ERROR_OUTOFMEMORY;
            goto AllocateHandleExit;
        }

        /* grow handle table */
        rghteTempTable = reinterpret_cast<HANDLE_TABLE_ENTRY*>(InternalRealloc(
            m_rghteHandleTable,
            (m_dwTableSize + m_dwTableGrowthRate) * sizeof(HANDLE_TABLE_ENTRY)));
        
        if (NULL == rghteTempTable)
        {
            WARN("not enough memory to grow handle table!\n");
            palError = ERROR_OUTOFMEMORY;
            goto AllocateHandleExit;
        }
        m_rghteHandleTable = rghteTempTable;

        /* update handle table and handle pool */
        for (DWORD dw = m_dwTableSize; dw < m_dwTableSize + m_dwTableGrowthRate; dw += 1)
        {
            /* new handles are initially invalid */
            /* the last "old" handle was m_dwTableSize-1, so the new
               handles range from m_dwTableSize to
               m_dwTableSize+m_dwTableGrowthRate-1 */
            m_rghteHandleTable[dw].u.hiNextIndex = dw + 1;
            m_rghteHandleTable[dw].fEntryAllocated = FALSE;
        }

        m_hiFreeListStart = m_dwTableSize;
        m_dwTableSize += m_dwTableGrowthRate;
        m_rghteHandleTable[m_dwTableSize - 1].u.hiNextIndex = (HANDLE_INDEX)-1;
        m_hiFreeListEnd = m_dwTableSize - 1;
        
    }

    /* take the next free handle */
    dwIndex = m_hiFreeListStart;

    /* remove the handle from the pool */
    m_hiFreeListStart = m_rghteHandleTable[dwIndex].u.hiNextIndex;
    
    /* clear the tail record if this is the last handle slot available */
    if(m_hiFreeListStart == c_hiInvalid) 
    {
        m_hiFreeListEnd = c_hiInvalid;
    }

    /* save the data associated with the new handle */
    *ph = HandleIndexToHandle(dwIndex);
    
    pObject->AddReference();
    m_rghteHandleTable[dwIndex].u.pObject = pObject;
    m_rghteHandleTable[dwIndex].dwAccessRights = dwAccessRights;
    m_rghteHandleTable[dwIndex].fInheritable = fInheritable;
    m_rghteHandleTable[dwIndex].fEntryAllocated = TRUE;

AllocateHandleExit:

    Unlock(pThread);

    return palError;    
}